

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * roaring::Roaring64Map::portableDeserializeFrozen(char *buf)

{
  ulong uVar1;
  ulong *in_RSI;
  Roaring64Map *in_RDI;
  Roaring read_var;
  uint32_t key;
  uint64_t lcv;
  uint64_t map_size;
  Roaring64Map *result;
  Roaring64Map *in_stack_ffffffffffffff80;
  Roaring *value;
  Roaring64Map *this;
  Roaring *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa8;
  ulong local_28;
  
  this = in_RDI;
  Roaring64Map(in_stack_ffffffffffffff80);
  uVar1 = *in_RSI;
  for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
    Roaring::portableDeserializeFrozen(in_stack_ffffffffffffffa8);
    value = (Roaring *)&stack0xffffffffffffffa8;
    Roaring::getSizeInBytes(in_stack_ffffffffffffff98,SUB81((ulong)this >> 0x38,0));
    emplaceOrInsert(this,(uint32_t)((ulong)in_RDI >> 0x20),value);
    Roaring::~Roaring(value);
  }
  return this;
}

Assistant:

static const Roaring64Map portableDeserializeFrozen(const char *buf) {
        Roaring64Map result;
        // get map size
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            // get map key
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            buf += sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::portableDeserializeFrozen(buf);
            // forward buffer past the last Roaring bitmap
            buf += read_var.getSizeInBytes(true);
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }